

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

int __thiscall Assimp::B3DImporter::ReadInt(B3DImporter *this)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  allocator<char> local_39;
  string local_38;
  B3DImporter *pBStack_10;
  int n;
  B3DImporter *this_local;
  
  uVar1 = this->_pos;
  pBStack_10 = this;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_buf);
  if (uVar1 + 4 <= sVar3) {
    piVar4 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (&this->_buf,(ulong)this->_pos);
    iVar2 = *piVar4;
    this->_pos = this->_pos + 4;
    return iVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EOF",&local_39);
  Fail(this,&local_38);
}

Assistant:

int B3DImporter::ReadInt(){
    if( _pos+4<=_buf.size() ){
        int n;
        memcpy(&n, &_buf[_pos], 4);
        _pos+=4;
        return n;
    }
    Fail( "EOF" );
    return 0;
}